

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilOpTestCase::test(StencilOpTestCase *this)

{
  int local_3c;
  int ndx;
  GLenum stencilOpValues [8];
  StencilOpTestCase *this_local;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_stencilOpName,0x1e00);
  ApiCase::expectError(&this->super_ApiCase,0);
  stencilOpValues[0] = 0x1e01;
  stencilOpValues[1] = 0x1e02;
  stencilOpValues[2] = 0x1e03;
  stencilOpValues[3] = 0x150a;
  stencilOpValues[4] = 0x8507;
  stencilOpValues[5] = 0x8508;
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])();
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_stencilOpName,(ulong)stencilOpValues[(long)local_3c + -2]);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_stencilOpName, GL_KEEP);
		expectError(GL_NO_ERROR);

		const GLenum stencilOpValues[] = {GL_KEEP, GL_ZERO, GL_REPLACE, GL_INCR, GL_DECR, GL_INVERT, GL_INCR_WRAP, GL_DECR_WRAP};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilOpValues); ++ndx)
		{
			SetStencilOp(stencilOpValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_stencilOpName, stencilOpValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}